

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_598a4::
CpuAbsoluteIndexedTest_sbc_absy_no_carry_or_overflow_with_pagecrossing_Test::
~CpuAbsoluteIndexedTest_sbc_absy_no_carry_or_overflow_with_pagecrossing_Test
          (CpuAbsoluteIndexedTest_sbc_absy_no_carry_or_overflow_with_pagecrossing_Test *this)

{
  CpuAbsoluteIndexedTest_sbc_absy_no_carry_or_overflow_with_pagecrossing_Test *this_local;
  
  ~CpuAbsoluteIndexedTest_sbc_absy_no_carry_or_overflow_with_pagecrossing_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest,
        sbc_absy_no_carry_or_overflow_with_pagecrossing) {
    registers.a = 0xD0;
    registers.p = V_FLAG | C_FLAG;
    expected.p = N_FLAG;
    expected.a = 0xE0;
    memory_content = 0xF0;

    run_read_instruction_with_pagecrossing(SBC_ABSY, IndexReg::Y);
}